

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  undefined1 local_78 [8];
  BlockCnt bl;
  FuncState new_fs;
  int line_local;
  int ismethod_local;
  expdesc *e_local;
  LexState *ls_local;
  
  bl._8_8_ = addprototype(ls);
  ((Proto *)bl._8_8_)->linedefined = line;
  open_func(ls,(FuncState *)&bl.firstlabel,(BlockCnt *)local_78);
  checknext(ls,0x28);
  if (ismethod != 0) {
    new_localvarliteral_(ls,"self",4);
    adjustlocalvars(ls,1);
  }
  parlist(ls);
  checknext(ls,0x29);
  statlist(ls);
  *(int *)(bl._8_8_ + 0x6c) = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  codeclosure(ls,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  `(' parlist `)' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}